

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3SegReaderCursor(Fts3Table *p,int iLangid,int iIndex,int iLevel,char *zTerm,int nTerm,
                       int isPrefix,int isScan,Fts3MultiSegReader *pCsr)

{
  Fts3Hash *pH;
  Fts3Table *pFVar1;
  int iVar2;
  int iVar3;
  Fts3SegReader **ppFVar4;
  long lVar5;
  Mem *pMVar6;
  i64 iVar7;
  char *zNode;
  Fts3SegReader *pNew;
  uint uVar8;
  Fts3SegReader **pOld;
  Fts3SegReader *pFVar9;
  u64 nBytes;
  uint uVar10;
  Fts3SegReader *pSeg;
  uint local_6c;
  sqlite3_int64 *local_68;
  uint local_5c;
  char *local_58;
  size_t local_50;
  Fts3Table *local_48;
  sqlite3_int64 iLeavesEndBlock;
  sqlite3_int64 iStartBlock;
  
  local_5c = isScan;
  local_6c = iIndex;
  local_58 = zTerm;
  if (iLevel < 0) {
    iVar2 = 0;
    local_48 = p;
    if (p->aIndex != (Fts3Index *)0x0) {
      pH = &p->aIndex[iIndex].hPending;
      if (isScan == 0 && isPrefix == 0) {
        pSeg = (Fts3SegReader *)sqlite3Fts3HashFindElem(pH,zTerm,nTerm);
        iVar2 = 0;
        if (pSeg != (Fts3SegReader *)0x0) {
          local_68 = (sqlite3_int64 *)CONCAT44(local_68._4_4_,iLevel);
          uVar8 = 1;
          ppFVar4 = &pSeg;
          goto LAB_001b4fce;
        }
      }
      else {
        pFVar9 = (Fts3SegReader *)pH->first;
        if (pFVar9 == (Fts3SegReader *)0x0) {
          pNew = (Fts3SegReader *)0x0;
          iVar2 = 0;
          ppFVar4 = (Fts3SegReader **)0x0;
          pSeg = pFVar9;
LAB_001b4fed:
          sqlite3_free(ppFVar4);
        }
        else {
          local_68 = (sqlite3_int64 *)CONCAT44(local_68._4_4_,iLevel);
          local_50 = (size_t)nTerm;
          uVar8 = 0;
          uVar10 = 0;
          pOld = (Fts3SegReader **)0x0;
          do {
            pSeg = pFVar9;
            ppFVar4 = pOld;
            if ((nTerm == 0) ||
               ((nTerm <= (int)pFVar9->iCurrentBlock &&
                (iVar2 = bcmp((void *)pFVar9->iEndBlock,local_58,local_50), iVar2 == 0)))) {
              if (uVar8 == uVar10) {
                iVar3 = sqlite3_initialize();
                iVar2 = 7;
                if (iVar3 != 0) goto LAB_001b4fe1;
                uVar10 = uVar8 * 8 + 0x80;
                nBytes = (u64)uVar10;
                if ((int)uVar10 < 1) {
                  nBytes = 0;
                }
                ppFVar4 = (Fts3SegReader **)sqlite3Realloc(pOld,nBytes);
                if (ppFVar4 == (Fts3SegReader **)0x0) goto LAB_001b4fe1;
                uVar10 = uVar8 + 0x10;
              }
              lVar5 = (long)(int)uVar8;
              uVar8 = uVar8 + 1;
              ppFVar4[lVar5] = pFVar9;
              pFVar9 = pSeg;
            }
            pFVar9 = *(Fts3SegReader **)pFVar9;
            pOld = ppFVar4;
          } while (pFVar9 != (Fts3SegReader *)0x0);
          pSeg = pFVar9;
          if ((int)uVar8 < 2) {
            if (uVar8 == 1) {
              uVar8 = 1;
              goto LAB_001b4fce;
            }
            iVar2 = 0;
LAB_001b4fe1:
            pNew = (Fts3SegReader *)0x0;
            ppFVar4 = pOld;
          }
          else {
            qsort(ppFVar4,(ulong)uVar8,8,fts3CompareElemByTerm);
LAB_001b4fce:
            iVar3 = sqlite3_initialize();
            iVar2 = 7;
            pOld = ppFVar4;
            if (iVar3 != 0) goto LAB_001b4fe1;
            local_50 = (ulong)uVar8 * 8 + 0x90;
            pNew = (Fts3SegReader *)sqlite3Malloc(local_50);
            if (pNew == (Fts3SegReader *)0x0) goto LAB_001b4fe1;
            memset(pNew,0,local_50);
            pNew->iIdx = 0x7fffffff;
            pNew->ppNextElem = (Fts3HashElem **)(pNew + 1);
            memcpy(pNew + 1,ppFVar4,(ulong)uVar8 << 3);
            iVar2 = 0;
          }
          iLevel = (int)local_68;
          if (isScan != 0 || isPrefix != 0) goto LAB_001b4fed;
        }
        if (pNew != (Fts3SegReader *)0x0 && iVar2 == 0) {
          iVar2 = fts3SegReaderCursorAppend(pCsr,pNew);
        }
      }
    }
    pFVar1 = local_48;
    pFVar9 = (Fts3SegReader *)0x0;
    if ((iLevel == -1) || (iVar2 != 0)) goto LAB_001b5223;
    pSeg = (Fts3SegReader *)0x0;
    iVar2 = fts3SqlStmt(local_48,0xd,(sqlite3_stmt **)&pSeg,(sqlite3_value **)0x0);
    pFVar9 = pSeg;
    if (iVar2 != 0) goto LAB_001b5223;
    lVar5 = (long)(int)local_6c;
    sqlite3_bind_int64((sqlite3_stmt *)pSeg,1,((long)pFVar1->nIndex * (long)iLangid + lVar5) * 0x400
                      );
    sqlite3_bind_int64((sqlite3_stmt *)pFVar9,2,
                       ((long)pFVar1->nIndex * (long)iLangid + lVar5) * 0x400 | 0x3ff);
  }
  else {
    local_68 = (sqlite3_int64 *)CONCAT44(local_68._4_4_,iLevel);
    pSeg = (Fts3SegReader *)0x0;
    iVar2 = fts3SqlStmt(p,0xc,(sqlite3_stmt **)&pSeg,(sqlite3_value **)0x0);
    pFVar9 = pSeg;
    if (iVar2 != 0) goto LAB_001b5223;
    local_48 = p;
    sqlite3_bind_int64((sqlite3_stmt *)pSeg,1,
                       ((ulong)local_68 & 0xffffffff) +
                       ((long)(int)local_6c + (long)iLangid * (long)p->nIndex) * 0x400);
  }
  local_68 = &iLeavesEndBlock;
  if (isPrefix == 0) {
    local_68 = (sqlite3_int64 *)0x0;
  }
  local_5c = local_5c | isPrefix;
  local_6c = (uint)(local_5c == 0);
  while (iVar2 = sqlite3_step((sqlite3_stmt *)pFVar9), iVar2 == 100) {
    pSeg = (Fts3SegReader *)0x0;
    pMVar6 = columnMem((sqlite3_stmt *)pFVar9,1);
    iVar7 = sqlite3VdbeIntValue(pMVar6);
    columnMallocFailure((sqlite3_stmt *)pFVar9);
    iStartBlock = iVar7;
    pMVar6 = columnMem((sqlite3_stmt *)pFVar9,2);
    iVar7 = sqlite3VdbeIntValue(pMVar6);
    columnMallocFailure((sqlite3_stmt *)pFVar9);
    iLeavesEndBlock = iVar7;
    pMVar6 = columnMem((sqlite3_stmt *)pFVar9,3);
    iVar7 = sqlite3VdbeIntValue(pMVar6);
    columnMallocFailure((sqlite3_stmt *)pFVar9);
    iVar3 = sqlite3_column_bytes((sqlite3_stmt *)pFVar9,4);
    pMVar6 = columnMem((sqlite3_stmt *)pFVar9,4);
    zNode = (char *)sqlite3_value_blob(pMVar6);
    columnMallocFailure((sqlite3_stmt *)pFVar9);
    if (((local_58 != (char *)0x0) && (iStartBlock != 0)) && (zNode != (char *)0x0)) {
      iVar2 = fts3SelectLeaf(local_48,local_58,nTerm,zNode,iVar3,&iStartBlock,local_68);
      if (iVar2 != 0) break;
      if (local_5c == 0) {
        iLeavesEndBlock = iStartBlock;
      }
    }
    iVar2 = sqlite3Fts3SegReaderNew
                      (pCsr->nSegment + 1,local_6c,iStartBlock,iLeavesEndBlock,iVar7,zNode,iVar3,
                       &pSeg);
    if ((iVar2 != 0) || (iVar2 = fts3SegReaderCursorAppend(pCsr,pSeg), iVar2 != 0)) break;
  }
LAB_001b5223:
  iVar3 = sqlite3_reset((sqlite3_stmt *)pFVar9);
  if (iVar2 != 0x65) {
    iVar3 = iVar2;
  }
  return iVar3;
}

Assistant:

static int fts3SegReaderCursor(
  Fts3Table *p,                   /* FTS3 table handle */
  int iLangid,                    /* Language id */
  int iIndex,                     /* Index to search (from 0 to p->nIndex-1) */
  int iLevel,                     /* Level of segments to scan */
  const char *zTerm,              /* Term to query for */
  int nTerm,                      /* Size of zTerm in bytes */
  int isPrefix,                   /* True for a prefix search */
  int isScan,                     /* True to scan from zTerm to EOF */
  Fts3MultiSegReader *pCsr        /* Cursor object to populate */
){
  int rc = SQLITE_OK;             /* Error code */
  sqlite3_stmt *pStmt = 0;        /* Statement to iterate through segments */
  int rc2;                        /* Result of sqlite3_reset() */

  /* If iLevel is less than 0 and this is not a scan, include a seg-reader 
  ** for the pending-terms. If this is a scan, then this call must be being
  ** made by an fts4aux module, not an FTS table. In this case calling
  ** Fts3SegReaderPending might segfault, as the data structures used by 
  ** fts4aux are not completely populated. So it's easiest to filter these
  ** calls out here.  */
  if( iLevel<0 && p->aIndex ){
    Fts3SegReader *pSeg = 0;
    rc = sqlite3Fts3SegReaderPending(p, iIndex, zTerm, nTerm, isPrefix||isScan, &pSeg);
    if( rc==SQLITE_OK && pSeg ){
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3AllSegdirs(p, iLangid, iIndex, iLevel, &pStmt);
    }

    while( rc==SQLITE_OK && SQLITE_ROW==(rc = sqlite3_step(pStmt)) ){
      Fts3SegReader *pSeg = 0;

      /* Read the values returned by the SELECT into local variables. */
      sqlite3_int64 iStartBlock = sqlite3_column_int64(pStmt, 1);
      sqlite3_int64 iLeavesEndBlock = sqlite3_column_int64(pStmt, 2);
      sqlite3_int64 iEndBlock = sqlite3_column_int64(pStmt, 3);
      int nRoot = sqlite3_column_bytes(pStmt, 4);
      char const *zRoot = sqlite3_column_blob(pStmt, 4);

      /* If zTerm is not NULL, and this segment is not stored entirely on its
      ** root node, the range of leaves scanned can be reduced. Do this. */
      if( iStartBlock && zTerm && zRoot ){
        sqlite3_int64 *pi = (isPrefix ? &iLeavesEndBlock : 0);
        rc = fts3SelectLeaf(p, zTerm, nTerm, zRoot, nRoot, &iStartBlock, pi);
        if( rc!=SQLITE_OK ) goto finished;
        if( isPrefix==0 && isScan==0 ) iLeavesEndBlock = iStartBlock;
      }
 
      rc = sqlite3Fts3SegReaderNew(pCsr->nSegment+1, 
          (isPrefix==0 && isScan==0),
          iStartBlock, iLeavesEndBlock, 
          iEndBlock, zRoot, nRoot, &pSeg
      );
      if( rc!=SQLITE_OK ) goto finished;
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

 finished:
  rc2 = sqlite3_reset(pStmt);
  if( rc==SQLITE_DONE ) rc = rc2;

  return rc;
}